

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.cpp
# Opt level: O0

Constant * __thiscall
spvtools::opt::analysis::ConstantManager::GetIntConst
          (ConstantManager *this,uint64_t val,int32_t bitWidth,bool isSigned)

{
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  IRContext *this_00;
  TypeManager *this_01;
  Type *type;
  allocator<unsigned_int> local_a1;
  uint local_a0;
  undefined4 local_9c;
  iterator local_98;
  size_type local_90;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_88;
  allocator<unsigned_int> local_6d;
  uint local_6c;
  iterator local_68;
  size_type local_60;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_58;
  ulong local_40;
  uint64_t mask;
  Type *pTStack_30;
  int32_t num_of_bit_to_ignore;
  Type *int_type;
  bool isSigned_local;
  uint64_t uStack_20;
  int32_t bitWidth_local;
  uint64_t val_local;
  ConstantManager *this_local;
  
  int_type._3_1_ = isSigned;
  int_type._4_4_ = bitWidth;
  uStack_20 = val;
  val_local = (uint64_t)this;
  this_00 = context(this);
  this_01 = IRContext::get_type_mgr(this_00);
  type = TypeManager::GetIntType(this_01,int_type._4_4_,(bool)(int_type._3_1_ & 1));
  if ((int_type._3_1_ & 1) == 0) {
    if (int_type._4_4_ < 0x40) {
      local_40 = (1L << ((byte)int_type._4_4_ & 0x3f)) - 1;
      uStack_20 = local_40 & uStack_20;
    }
  }
  else {
    mask._4_4_ = 0x40 - int_type._4_4_;
    uStack_20 = (long)(uStack_20 << ((byte)mask._4_4_ & 0x3f)) >> ((byte)mask._4_4_ & 0x3f);
  }
  local_a0 = (uint)uStack_20;
  pTStack_30 = type;
  if (int_type._4_4_ < 0x21) {
    local_68 = &local_6c;
    local_60 = 1;
    local_6c = local_a0;
    std::allocator<unsigned_int>::allocator(&local_6d);
    __l_00._M_len = local_60;
    __l_00._M_array = local_68;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_58,__l_00,&local_6d);
    this_local = (ConstantManager *)GetConstant(this,type,&local_58);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_58);
    std::allocator<unsigned_int>::~allocator(&local_6d);
  }
  else {
    local_9c = (undefined4)(uStack_20 >> 0x20);
    local_98 = &local_a0;
    local_90 = 2;
    std::allocator<unsigned_int>::allocator(&local_a1);
    __l._M_len = local_90;
    __l._M_array = local_98;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_88,__l,&local_a1);
    this_local = (ConstantManager *)GetConstant(this,type,&local_88);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_88);
    std::allocator<unsigned_int>::~allocator(&local_a1);
  }
  return (Constant *)this_local;
}

Assistant:

const Constant* ConstantManager::GetIntConst(uint64_t val, int32_t bitWidth,
                                             bool isSigned) {
  Type* int_type = context()->get_type_mgr()->GetIntType(bitWidth, isSigned);

  if (isSigned) {
    // Sign extend the value.
    int32_t num_of_bit_to_ignore = 64 - bitWidth;
    val = static_cast<int64_t>(val << num_of_bit_to_ignore) >>
          num_of_bit_to_ignore;
  } else if (bitWidth < 64) {
    // Clear the upper bit that are not used.
    uint64_t mask = ((1ull << bitWidth) - 1);
    val &= mask;
  }

  if (bitWidth <= 32) {
    return GetConstant(int_type, {static_cast<uint32_t>(val)});
  }

  // If the value is more than 32-bit, we need to split the operands into two
  // 32-bit integers.
  return GetConstant(
      int_type, {static_cast<uint32_t>(val), static_cast<uint32_t>(val >> 32)});
}